

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

bool __thiscall ON_SHA1_Hash::Write(ON_SHA1_Hash *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(archive,0x40008000,1,0);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteByte(archive,0x14,this);
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    bVar2 = bVar2 && bVar1;
  }
  return bVar2;
}

Assistant:

bool ON_SHA1_Hash::Write(
  class ON_BinaryArchive& archive
  ) const
{
  if (!archive.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,0))
    return false;
  bool rc = archive.WriteByte(20,m_digest);
  if (!archive.EndWrite3dmChunk())
    rc = false;
  return rc;
}